

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

Token * __thiscall Tokenizer::nextToken(Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  runtime_error *this_00;
  Stream *in_RSI;
  Tokenizer *in_RDI;
  string *in_stack_000000f0;
  Tokenizer *in_stack_00000188;
  Tokenizer *in_stack_000001c8;
  Tokenizer *in_stack_00000208;
  Tokenizer *in_stack_00000378;
  Tokenizer *in_stack_fffffffffffffef8;
  Tokenizer *in_stack_ffffffffffffff00;
  bool local_f1;
  Tokenizer *this_01;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string local_68 [104];
  
  this_01 = in_RDI;
  cVar1 = Stream::peek((Stream *)0x163a66);
  if (cVar1 == -1) {
    Stream::getMark(in_RSI);
    Token::Token((Token *)in_stack_ffffffffffffff00,(Mark *)in_stack_fffffffffffffef8);
    Token::operator=((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
    Token::~Token((Token *)0x163cf4);
  }
  else {
    do {
      bVar2 = tryToSkipSpaces(in_stack_ffffffffffffff00);
      local_f1 = true;
      if (!bVar2) {
        local_f1 = tryToSkipComments(this_01);
      }
    } while (local_f1 != false);
    bVar2 = tryToGetKeywordOrIdentifier(in_stack_000001c8);
    if (bVar2) {
      Token::Token((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
      return (Token *)in_RDI;
    }
    bVar2 = tryToGetString(in_stack_00000188);
    if (bVar2) {
      Token::Token((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
      return (Token *)in_RDI;
    }
    bVar2 = tryToGetNumber(in_stack_00000208);
    if (bVar2) {
      Token::Token((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
      return (Token *)in_RDI;
    }
    bVar2 = tryToGetSingleCharToken(in_stack_00000378);
    if (bVar2) {
      Token::Token((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
      return (Token *)in_RDI;
    }
    bVar2 = tryToGetCompoundToken(in_stack_fffffffffffffef8);
    if (bVar2) {
      Token::Token((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
      return (Token *)in_RDI;
    }
    cVar1 = Stream::peek((Stream *)0x163b77);
    if (cVar1 != -1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      makeErrorMessage(this,in_stack_000000f0);
      std::runtime_error::runtime_error(this_00,local_68);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream::getMark(in_RSI);
    Token::Token((Token *)in_stack_ffffffffffffff00,(Mark *)in_stack_fffffffffffffef8);
    Token::operator=((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
    Token::~Token((Token *)0x163bbc);
  }
  Token::Token((Token *)in_stack_ffffffffffffff00,(Token *)in_stack_fffffffffffffef8);
  return (Token *)in_RDI;
}

Assistant:

Token Tokenizer::nextToken()
{
  if(stream_.peek() != EOF)
  {
    while(tryToSkipSpaces() || tryToSkipComments());

    if(tryToGetKeywordOrIdentifier())
      return token_;
    else if(tryToGetString())
      return token_;
    else if(tryToGetNumber())
      return token_;
    else if(tryToGetSingleCharToken())
      return token_;
    else if(tryToGetCompoundToken())
      return token_;
    else if(stream_.peek() == EOF)
      token_ = Token{stream_.getMark()};
    else
      throw std::runtime_error(makeErrorMessage("Unexpected character!"));
  }
  else
    token_ = Token{stream_.getMark()};

  return token_;
}